

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

int AF_AActor_A_PlayerScream
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *actor;
  bool bVar1;
  int iVar2;
  player_t *ppVar3;
  FSoundID *sound_id;
  int channel;
  char *__assertion;
  int iVar4;
  uint uVar5;
  FSoundID local_38;
  FSoundID local_34;
  FSoundID local_30;
  FSoundID local_2c;
  
  sound_id = &local_38;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
LAB_00466fba:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x641,
                  "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') || ((param->field_0).field_1.atag != 1)) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00466fba;
  }
  actor = *(AActor **)&param->field_0;
  bVar1 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
    goto LAB_00466fba;
  }
  ppVar3 = actor->player;
  iVar4 = (actor->DeathSound).super_FSoundID.ID;
  if (ppVar3 == (player_t *)0x0) {
    if (iVar4 != 0) goto LAB_00466dec;
    local_30.ID = S_FindSound("*death");
    sound_id = &local_30;
  }
  else {
    if (iVar4 == 0) {
      iVar4 = 2;
      channel = 4;
      if ((((level.flags >> 0xf | dmflags.Value) & 0x18) == 0) || (-39.0 < (actor->Vel).Z)) {
LAB_00466e26:
        if (actor->special1 < 10) {
          iVar2 = S_FindSkinnedSoundEx
                            (actor,"*wimpydeath",
                             FName::NameData.NameArray[(ppVar3->LastDamageType).Index].Text);
          if (iVar2 == 0) {
            ppVar3 = actor->player;
            goto LAB_00466e67;
          }
        }
        else {
LAB_00466e67:
          if (actor->health < -0x31) {
            if (0xffffff9c < (uint)actor->health) {
              iVar2 = S_FindSkinnedSoundEx
                                (actor,"*crazydeath",
                                 FName::NameData.NameArray[(ppVar3->LastDamageType).Index].Text);
              if (iVar2 != 0) goto LAB_00466f47;
              ppVar3 = actor->player;
            }
            iVar2 = S_FindSkinnedSoundEx
                              (actor,"*xdeath",
                               FName::NameData.NameArray[(ppVar3->LastDamageType).Index].Text);
            if (iVar2 != 0) goto LAB_00466f47;
            iVar2 = S_FindSkinnedSoundEx
                              (actor,"*gibbed",
                               FName::NameData.NameArray[(actor->player->LastDamageType).Index].Text
                              );
            if (iVar2 != 0) goto LAB_00466f80;
            ppVar3 = actor->player;
            iVar4 = 4;
          }
          iVar2 = S_FindSkinnedSoundEx
                            (actor,"*death",
                             FName::NameData.NameArray[(ppVar3->LastDamageType).Index].Text);
        }
LAB_00466f47:
        channel = iVar4;
        if (iVar4 == 2) {
          channel = 2;
          local_38.ID = iVar2;
          goto LAB_00466f66;
        }
      }
      else {
        local_34.ID = S_FindSound("*splat");
        iVar2 = S_FindSkinnedSound(actor,&local_34);
        if (iVar2 == 0) {
          ppVar3 = actor->player;
          iVar4 = 4;
          goto LAB_00466e26;
        }
      }
LAB_00466f80:
      for (uVar5 = 0xfffffffd; sound_id = &local_38, local_38.ID = iVar2, uVar5 != 5;
          uVar5 = uVar5 + 1) {
        if (uVar5 < 0xfffffffe) {
          S_StopSound(actor,uVar5 + 3);
        }
      }
      goto LAB_00466f66;
    }
LAB_00466dec:
    sound_id = &local_2c;
    local_2c.ID = iVar4;
  }
  channel = 2;
LAB_00466f66:
  S_Sound(actor,channel,sound_id,1.0,1.0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PlayerScream)
{
	PARAM_SELF_PROLOGUE(AActor);

	int sound = 0;
	int chan = CHAN_VOICE;

	if (self->player == NULL || self->DeathSound != 0)
	{
		if (self->DeathSound != 0)
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, "*death", 1, ATTN_NORM);
		}
		return 0;
	}

	// Handle the different player death screams
	if ((((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX)) &&
		self->Vel.Z <= -39)
	{
		sound = S_FindSkinnedSound (self, "*splat");
		chan = CHAN_BODY;
	}

	if (!sound && self->special1<10)
	{ // Wimpy death sound
		sound = S_FindSkinnedSoundEx (self, "*wimpydeath", self->player->LastDamageType);
	}
	if (!sound && self->health <= -50)
	{
		if (self->health > -100)
		{ // Crazy death sound
			sound = S_FindSkinnedSoundEx (self, "*crazydeath", self->player->LastDamageType);
		}
		if (!sound)
		{ // Extreme death sound
			sound = S_FindSkinnedSoundEx (self, "*xdeath", self->player->LastDamageType);
			if (!sound)
			{
				sound = S_FindSkinnedSoundEx (self, "*gibbed", self->player->LastDamageType);
				chan = CHAN_BODY;
			}
		}
	}
	if (!sound)
	{ // Normal death sound
		sound = S_FindSkinnedSoundEx (self, "*death", self->player->LastDamageType);
	}

	if (chan != CHAN_VOICE)
	{
		for (int i = 0; i < 8; ++i)
		{ // Stop most playing sounds from this player.
		  // This is mainly to stop *land from messing up *splat.
			if (i != CHAN_WEAPON && i != CHAN_VOICE)
			{
				S_StopSound (self, i);
			}
		}
	}
	S_Sound (self, chan, sound, 1, ATTN_NORM);
	return 0;
}